

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_monte_carlo.cpp
# Opt level: O1

double triangle01_monomial_integral(int *e)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  
  lVar2 = 0;
  do {
    if (e[lVar2] < 0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"TRIANGLE01_MONOMIAL_INTEGRAL - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  All exponents must be nonnegative.\n");
      exit(1);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  iVar1 = 0;
  dVar7 = 1.0;
  lVar2 = 0;
  do {
    iVar3 = e[lVar2];
    if (0 < iVar3) {
      dVar8 = 1.0;
      iVar5 = iVar3;
      iVar4 = iVar1;
      do {
        iVar4 = iVar4 + 1;
        dVar7 = (dVar7 * dVar8) / (double)iVar4;
        dVar8 = dVar8 + 1.0;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      iVar1 = iVar1 + iVar3;
    }
    bVar6 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar6);
  iVar3 = 0;
  do {
    dVar7 = dVar7 / (double)(iVar1 + 1 + iVar3);
    iVar3 = iVar3 + 1;
  } while (iVar3 == 1);
  return dVar7;
}

Assistant:

double triangle01_monomial_integral ( int e[] )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE01_MONOMIAL_INTEGRAL: monomial integrals in the unit triangle in 2D.
//
//  Discussion:
//
//    The monomial is F(X,Y) = X^E(1) * Y^E(2).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int E[2], the exponents.  
//    Each exponent must be nonnegative.
//
//    Output, double TRIANGLE01_MONOMIAL_INTEGRAL, the integral.
//
{
  int i;
  double integral;
  int j;
  int k;
  const int m = 2;

  for ( i = 0; i < m; i++ )
  {
    if ( e[i] < 0 )
    {
      std::cerr << "\n";
      std::cerr << "TRIANGLE01_MONOMIAL_INTEGRAL - Fatal error!\n";
      std::cerr << "  All exponents must be nonnegative.\n";
      exit ( 1 );
    }
  }

  k = 0;
  integral = 1.0;

  for ( i = 0; i < m; i++ )
  {
    for ( j = 1; j <= e[i]; j++ )
    {
      k = k + 1;
      integral = integral * double( j ) / double( k );
    }
  }

  for ( i = 0; i < m; i++ )
  {
    k = k + 1;
    integral = integral / double( k );
  }

  return integral;
}